

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O2

void aom_extend_frame_borders_plane_row_c(YV12_BUFFER_CONFIG *ybf,int plane,int v_start,int v_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int extend_top;
  int extend_left;
  int iVar4;
  int extend_right;
  ulong uVar5;
  
  iVar4 = 0;
  uVar5 = (ulong)(0 < plane);
  iVar1 = ybf->subsampling_y;
  if (plane < 1) {
    iVar1 = iVar4;
  }
  iVar2 = ybf->subsampling_x;
  if (plane < 1) {
    iVar2 = iVar4;
  }
  iVar3 = ybf->border >> ((byte)iVar1 & 0x1f);
  extend_left = ybf->border >> ((byte)iVar2 & 0x1f);
  iVar1 = *(int *)((long)ybf->store_buf_adr + uVar5 * 4 + -0x38);
  iVar2 = *(int *)((long)ybf->store_buf_adr + uVar5 * 4 + -0x30);
  extend_right = (*(int *)((long)ybf->store_buf_adr + uVar5 * 4 + -0x48) + extend_left) - iVar1;
  extend_top = iVar3;
  if (v_start != 0) {
    extend_top = 0;
  }
  iVar3 = (*(int *)((long)ybf->store_buf_adr + uVar5 * 4 + -0x40) + iVar3) - iVar2;
  if (iVar2 != v_end) {
    iVar3 = iVar4;
  }
  iVar4 = *(int *)((long)ybf->store_buf_adr + uVar5 * 4 + -0x28);
  if ((ybf->flags & 8) == 0) {
    extend_plane(ybf->store_buf_adr[(long)plane + -4],iVar4,iVar1,iVar2,extend_top,extend_left,iVar3
                 ,extend_right,v_start,v_end);
  }
  else {
    extend_plane_high(ybf->store_buf_adr[(long)plane + -4],iVar4,iVar1,iVar2,extend_top,extend_left,
                      iVar3,extend_right,v_start,v_end);
  }
  return;
}

Assistant:

void aom_extend_frame_borders_plane_row_c(const YV12_BUFFER_CONFIG *ybf,
                                          int plane, int v_start, int v_end) {
  const int ext_size = ybf->border;
  const int ss_x = ybf->subsampling_x;
  const int ss_y = ybf->subsampling_y;

  assert(ybf->y_height - ybf->y_crop_height < 16);
  assert(ybf->y_width - ybf->y_crop_width < 16);
  assert(ybf->y_height - ybf->y_crop_height >= 0);
  assert(ybf->y_width - ybf->y_crop_width >= 0);

  const int is_uv = plane > 0;
  const int top = ext_size >> (is_uv ? ss_y : 0);
  const int left = ext_size >> (is_uv ? ss_x : 0);
  const int bottom = top + ybf->heights[is_uv] - ybf->crop_heights[is_uv];
  const int right = left + ybf->widths[is_uv] - ybf->crop_widths[is_uv];
  const int extend_top_border = (v_start == 0);
  const int extend_bottom_border = (v_end == ybf->crop_heights[is_uv]);

#if CONFIG_AV1_HIGHBITDEPTH
  if (ybf->flags & YV12_FLAG_HIGHBITDEPTH) {
    extend_plane_high(ybf->buffers[plane], ybf->strides[is_uv],
                      ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
                      extend_top_border ? top : 0, left,
                      extend_bottom_border ? bottom : 0, right, v_start, v_end);
    return;
  }
#endif

  extend_plane(ybf->buffers[plane], ybf->strides[is_uv],
               ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
               extend_top_border ? top : 0, left,
               extend_bottom_border ? bottom : 0, right, v_start, v_end);
}